

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O3

bool __thiscall cmParsePHPCoverage::ReadInt(cmParsePHPCoverage *this,istream *in,int *v)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  char c;
  string s;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = '\0';
  local_48 = &local_38;
  while (plVar3 = (long *)std::istream::get((char *)in), pcVar1 = local_48,
        (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    std::__cxx11::string::push_back((char)&local_48);
  }
  iVar2 = atoi(local_48);
  *v = iVar2;
  if (pcVar1 != &local_38) {
    operator_delete(pcVar1,CONCAT71(uStack_37,local_38) + 1);
  }
  return true;
}

Assistant:

bool cmParsePHPCoverage::ReadInt(std::istream& in, int& v)
{
  std::string s;
  char c = 0;
  while(in.get(c) && c != ':' && c != ';')
    {
    s += c;
    }
  v = atoi(s.c_str());
  return true;
}